

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_conn.cc
# Opt level: O1

lp_connection_t __thiscall CSocekt::flyd_get_connection(CSocekt *this,int isock)

{
  size_t *psVar1;
  int *piVar2;
  int iVar3;
  time_t tVar4;
  CMemory *this_00;
  lp_connection_t pfVar5;
  _List_node_base *p_Var6;
  long lVar7;
  
  muduo::MutexLock::lock(&this->m_connectionMutex);
  p_Var6 = (this->m_freeconnectionList).
           super__List_base<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  if (p_Var6 == (_List_node_base *)&this->m_freeconnectionList) {
    this_00 = CMemory::GetInstance();
    pfVar5 = (lp_connection_t)CMemory::AllocMemory(this_00,0x120,true);
    pfVar5->_vptr_flyd_connection_s = (_func_int **)&PTR__flyd_connection_s_00125b00;
    (pfVar5->logicPorcMutex).holder_ = 0;
    pthread_mutex_init((pthread_mutex_t *)&pfVar5->logicPorcMutex,(pthread_mutexattr_t *)0x0);
    (pfVar5->iThrowsendCount).value_ = 0;
    (pfVar5->iSendCount).value_ = 0;
    pfVar5->iCurrsequence = 1;
    pfVar5->fd = 0xffffffff;
    pfVar5->curStat = '\0';
    pfVar5->precvbuf = pfVar5->dataHeadInfo;
    pfVar5->irecvlen = 8;
    pfVar5->precvMemPointer = (char *)0x0;
    LOCK();
    (pfVar5->iThrowsendCount).value_ = 0;
    UNLOCK();
    pfVar5->psendMemPointer = (char *)0x0;
    pfVar5->events = 0;
    tVar4 = time((time_t *)0x0);
    pfVar5->lastPingTime = tVar4;
    p_Var6 = (_List_node_base *)operator_new(0x18);
    p_Var6[1]._M_next = (_List_node_base *)pfVar5;
    std::__detail::_List_node_base::_M_hook(p_Var6);
    psVar1 = &(this->m_connectionList).
              super__List_base<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 + 1;
    iVar3 = 1;
    lVar7 = 0xa8;
  }
  else {
    pfVar5 = (lp_connection_t)p_Var6[1]._M_next;
    psVar1 = &(this->m_freeconnectionList).
              super__List_base<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var6);
    pfVar5->iCurrsequence = pfVar5->iCurrsequence + 1;
    pfVar5->fd = 0xffffffff;
    pfVar5->curStat = '\0';
    pfVar5->precvbuf = pfVar5->dataHeadInfo;
    pfVar5->irecvlen = 8;
    pfVar5->precvMemPointer = (char *)0x0;
    LOCK();
    (pfVar5->iThrowsendCount).value_ = 0;
    UNLOCK();
    pfVar5->psendMemPointer = (char *)0x0;
    pfVar5->events = 0;
    tVar4 = time((time_t *)0x0);
    pfVar5->lastPingTime = tVar4;
    iVar3 = -1;
    lVar7 = 0xac;
  }
  LOCK();
  piVar2 = (int *)((long)&this->_vptr_CSocekt + lVar7);
  *piVar2 = *piVar2 + iVar3;
  UNLOCK();
  pfVar5->fd = isock;
  (this->m_connectionMutex).holder_ = 0;
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_connectionMutex);
  return pfVar5;
}

Assistant:

lp_connection_t CSocekt::flyd_get_connection(int isock)
{
    //因为可能有其他线程要访问m_freeconnectionList，m_connectionList
    //【比如可能有专门的释放线程要释放/或者主线程要释放】之类的，所以应该临界一下
    muduo::MutexLockGuard lock(m_connectionMutex);

     if(!m_freeconnectionList.empty())
    {
        //有空闲的，自然是从空闲的中摘取
        lp_connection_t p_Conn = m_freeconnectionList.front(); //返回第一个元素但不检查元素存在与否
        m_freeconnectionList.pop_front();                         //移除第一个元素但不返回	
        p_Conn->GetOneToUse();
        m_free_connection_n.decrement(); 
        p_Conn->fd = isock;
        return p_Conn;
    }

    //走到这里，表示没空闲的连接了，那就考虑重新创建一个连接
    CMemory *p_memory = CMemory::GetInstance();
    lp_connection_t p_Conn = (lp_connection_t)p_memory->AllocMemory(sizeof(flyd_connection_t),true);
    p_Conn = new(p_Conn) flyd_connection_t();
    p_Conn->GetOneToUse();
    m_connectionList.push_back(p_Conn); //入到总表中来，但不能入到空闲表中来，因为凡是调这个函数的，肯定是要用这个连接的
    m_total_connection_n.increment();             
    p_Conn->fd = isock;
    return p_Conn;

}